

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
duckdb::Connection::
CreateAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
          (Connection *this,string *name)

{
  type pCVar1;
  long lVar2;
  string *in_RDX;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  AggregateFunction function;
  LogicalType aLStack_298 [24];
  undefined **local_280 [18];
  LogicalType local_1f0 [32];
  undefined8 auStack_1d0 [14];
  element_type *local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  undefined1 local_150 [176];
  undefined8 auStack_a0 [14];
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  bVar5 = 0;
  UDFWrapper::
  CreateBinaryAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
            ((AggregateFunction *)local_150,(UDFWrapper *)name,in_RDX);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_280,(SimpleFunction *)local_150);
  local_280[0] = (undefined **)std::ostream::write;
  duckdb::LogicalType::LogicalType(local_1f0,(LogicalType *)(local_150 + 0x90));
  local_1f0[0x18] = (LogicalType)local_150[0xa8];
  local_1f0[0x19] = (LogicalType)local_150[0xa9];
  local_1f0[0x1a] = (LogicalType)local_150[0xaa];
  local_1f0[0x1b] = (LogicalType)local_150[0xab];
  local_280[0] = &PTR__AggregateFunction_005d0ea0;
  puVar3 = auStack_a0;
  puVar4 = auStack_1d0;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  auStack_1d0[0xd]._0_1_ = (AggregateOrderDependent)auStack_a0[0xd];
  auStack_1d0[0xd]._1_1_ = auStack_a0[0xd]._1_1_;
  local_160 = local_30;
  local_158 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(aLStack_298,INVALID);
  duckdb::UDFWrapper::RegisterAggrFunction(local_280,pCVar1,aLStack_298);
  duckdb::LogicalType::~LogicalType(aLStack_298);
  local_280[0] = &PTR__AggregateFunction_005d0ea0;
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_280);
  local_150._0_8_ = &PTR__AggregateFunction_005d0ea0;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_150);
  return;
}

Assistant:

void CreateAggregateFunction(const string &name) {
		AggregateFunction function = UDFWrapper::CreateAggregateFunction<UDF_OP, STATE, TR, TA, TB>(name);
		UDFWrapper::RegisterAggrFunction(function, *context);
	}